

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O2

bool ZXing::IsInside<ZXing::PointT<int>>(PointT<int> *p,Quadrilateral<ZXing::PointT<int>_> *q)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  iVar2 = 0;
  iVar7 = 0;
  for (lVar6 = 1; lVar6 != 5; lVar6 = lVar6 + 1) {
    iVar8 = (q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[lVar6 + -1].x;
    iVar5 = (q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[lVar6 + -1].y;
    uVar3 = (uint)lVar6 & 3;
    iVar4 = ((q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[uVar3].x - iVar8) * (iVar5 - p->y);
    iVar5 = ((q->super_array<ZXing::PointT<int>,_4UL>)._M_elems[uVar3].y - iVar5) * (p->x - iVar8);
    iVar8 = iVar7;
    if (iVar5 + iVar4 < 0) {
      iVar8 = iVar2;
    }
    iVar1 = iVar8 + 1;
    if (-1 < iVar5 + iVar4) {
      iVar7 = iVar8 + 1;
      iVar1 = iVar2;
    }
    iVar2 = iVar1;
  }
  return iVar2 == 0 || iVar7 == 0;
}

Assistant:

bool IsInside(const PointT& p, const Quadrilateral<PointT>& q)
{
	// Test if p is on the same side (right or left) of all polygon segments
	int pos = 0, neg = 0;
	for (int i = 0; i < Size(q); ++i)
		(cross(p - q[i], q[(i + 1) % Size(q)] - q[i]) < 0 ? neg : pos)++;
	return pos == 0 || neg == 0;
}